

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units.cpp
# Opt level: O1

void __thiscall
Units_isBaseUnitImportReferenceUnresolved_Test::TestBody
          (Units_isBaseUnitImportReferenceUnresolved_Test *this)

{
  string *psVar1;
  char cVar2;
  byte bVar3;
  AssertionResult gtest_ar_;
  UnitsPtr u2;
  ImportSourcePtr import;
  ModelPtr model;
  UnitsPtr u1;
  long *local_90;
  AssertHelper local_88 [8];
  AssertionResult local_80;
  long local_70 [2];
  byte local_60 [8];
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_58;
  string *local_50;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_48;
  string *local_40;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_38;
  string *local_30;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_28;
  string *local_20;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_18;
  
  libcellml::Model::create();
  psVar1 = local_30;
  local_80._0_8_ = local_70;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_80,"model","");
  libcellml::NamedEntity::setName(psVar1);
  if ((long *)local_80._0_8_ != local_70) {
    operator_delete((void *)local_80._0_8_,local_70[0] + 1);
  }
  libcellml::Units::create();
  local_80._0_8_ = local_70;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_80,"u","");
  libcellml::NamedEntity::setName(local_20);
  if ((long *)local_80._0_8_ != local_70) {
    operator_delete((void *)local_80._0_8_,local_70[0] + 1);
  }
  libcellml::Units::create();
  psVar1 = local_50;
  local_80._0_8_ = local_70;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_80,"some_other_u","");
  libcellml::NamedEntity::setName(psVar1);
  if ((long *)local_80._0_8_ != local_70) {
    operator_delete((void *)local_80._0_8_,local_70[0] + 1);
  }
  libcellml::ImportSource::create();
  psVar1 = local_40;
  local_80._0_8_ = local_70;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_80,"I_am_a_url","");
  libcellml::ImportSource::setUrl(psVar1);
  if ((long *)local_80._0_8_ != local_70) {
    operator_delete((void *)local_80._0_8_,local_70[0] + 1);
  }
  libcellml::Model::addUnits((shared_ptr *)local_30);
  libcellml::ImportedEntity::setImportSource((shared_ptr *)(local_50 + 0x10));
  libcellml::ImportSource::setModel((shared_ptr *)local_40);
  local_60[0] = libcellml::ImportedEntity::isImport();
  local_58.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (local_60[0] == 0) {
    testing::Message::Message((Message *)&local_90);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_80,(char *)local_60,"u2->isImport()","false");
    testing::internal::AssertHelper::AssertHelper
              (local_88,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/units/units.cpp"
               ,0x8db,(char *)local_80._0_8_);
    testing::internal::AssertHelper::operator=(local_88,(Message *)&local_90);
    testing::internal::AssertHelper::~AssertHelper(local_88);
    if ((long *)local_80._0_8_ != local_70) {
      operator_delete((void *)local_80._0_8_,local_70[0] + 1);
    }
    if (local_90 != (long *)0x0) {
      cVar2 = testing::internal::IsTrue(true);
      if ((cVar2 != '\0') && (local_90 != (long *)0x0)) {
        (**(code **)(*local_90 + 8))();
      }
      local_90 = (long *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_58,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  libcellml::ImportedEntity::importReference_abi_cxx11_();
  local_60[0] = local_80.message_.ptr_ ==
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_58.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if ((long *)local_80._0_8_ != local_70) {
    operator_delete((void *)local_80._0_8_,local_70[0] + 1);
  }
  if (local_60[0] == 0) {
    testing::Message::Message((Message *)&local_90);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_80,(char *)local_60,"u2->importReference().empty()","false");
    testing::internal::AssertHelper::AssertHelper
              (local_88,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/units/units.cpp"
               ,0x8dc,(char *)local_80._0_8_);
    testing::internal::AssertHelper::operator=(local_88,(Message *)&local_90);
    testing::internal::AssertHelper::~AssertHelper(local_88);
    if ((long *)local_80._0_8_ != local_70) {
      operator_delete((void *)local_80._0_8_,local_70[0] + 1);
    }
    if (local_90 != (long *)0x0) {
      cVar2 = testing::internal::IsTrue(true);
      if ((cVar2 != '\0') && (local_90 != (long *)0x0)) {
        (**(code **)(*local_90 + 8))();
      }
      local_90 = (long *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_58,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  bVar3 = libcellml::Units::isBaseUnit();
  local_60[0] = bVar3 ^ 1;
  local_58.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (bVar3 != 0) {
    testing::Message::Message((Message *)&local_90);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_80,(char *)local_60,"u2->isBaseUnit()","true");
    testing::internal::AssertHelper::AssertHelper
              (local_88,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/units/units.cpp"
               ,0x8dd,(char *)local_80._0_8_);
    testing::internal::AssertHelper::operator=(local_88,(Message *)&local_90);
    testing::internal::AssertHelper::~AssertHelper(local_88);
    if ((long *)local_80._0_8_ != local_70) {
      operator_delete((void *)local_80._0_8_,local_70[0] + 1);
    }
    if (local_90 != (long *)0x0) {
      cVar2 = testing::internal::IsTrue(true);
      if ((cVar2 != '\0') && (local_90 != (long *)0x0)) {
        (**(code **)(*local_90 + 8))();
      }
      local_90 = (long *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_58,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  if (local_38 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_38);
  }
  if (local_48 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_48);
  }
  if (local_18 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_18);
  }
  if (local_28 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_28);
  }
  return;
}

Assistant:

TEST(Units, isBaseUnitImportReferenceUnresolved)
{
    libcellml::ModelPtr model = libcellml::Model::create();
    model->setName("model");

    libcellml::UnitsPtr u1 = libcellml::Units::create();
    u1->setName("u");
    libcellml::UnitsPtr u2 = libcellml::Units::create();
    u2->setName("some_other_u");

    libcellml::ImportSourcePtr import = libcellml::ImportSource::create();
    import->setUrl("I_am_a_url");

    model->addUnits(u1);

    u2->setImportSource(import);
    import->setModel(model);

    EXPECT_TRUE(u2->isImport());
    EXPECT_TRUE(u2->importReference().empty());
    EXPECT_FALSE(u2->isBaseUnit());
}